

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O1

void __thiscall ncnn::Layer_final::set_layer_properties(Layer_final *this)

{
  Layer *pLVar1;
  
  pLVar1 = this->layer_cpu;
  pLVar1->userdata = (this->super_Layer).userdata;
  std::vector<int,_std::allocator<int>_>::operator=(&pLVar1->bottoms,&(this->super_Layer).bottoms);
  std::vector<int,_std::allocator<int>_>::operator=
            (&this->layer_cpu->tops,&(this->super_Layer).tops);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
            (&this->layer_cpu->bottom_shapes,&(this->super_Layer).bottom_shapes);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
            (&this->layer_cpu->top_shapes,&(this->super_Layer).top_shapes);
  this->layer_cpu->featmask = (this->super_Layer).featmask;
  return;
}

Assistant:

void set_layer_properties()
    {
        layer_cpu->userdata = userdata;

        layer_cpu->bottoms = bottoms;
        layer_cpu->tops = tops;
        layer_cpu->bottom_shapes = bottom_shapes;
        layer_cpu->top_shapes = top_shapes;
        layer_cpu->featmask = featmask;

#if NCNN_VULKAN
        if (layer_vulkan)
        {
            layer_vulkan->vkdev = vkdev;

            layer_vulkan->userdata = userdata;

            layer_vulkan->bottoms = bottoms;
            layer_vulkan->tops = tops;
            layer_vulkan->bottom_shapes = bottom_shapes;
            layer_vulkan->top_shapes = top_shapes;
            layer_vulkan->featmask = featmask;
        }
#endif
    }